

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O3

void __thiscall Qentem::QExpression::operator+=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 in_ZMM0 [64];
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      dVar3 = *(double *)&right->field_0;
    }
    else if (EVar1 == IntegerNumber) {
      dVar3 = (double)(long)(right->field_0).SubExpressions.storage_;
    }
    else {
      if (EVar1 != NaturalNumber) {
        return;
      }
      auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(right->field_0).SubExpressions.storage_);
      dVar3 = auVar2._0_8_;
    }
    *(double *)&this->field_0 = dVar3 + *(double *)&this->field_0;
    return;
  }
  if (EVar1 == IntegerNumber) {
    if (right->Type - 2 < 2) {
LAB_00128401:
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)&((right->field_0).SubExpressions.storage_)->field_0 +
           (long)&((this->field_0).SubExpressions.storage_)->field_0);
      return;
    }
    if (right->Type == RealNumber) {
      dVar3 = (double)(long)(this->field_0).SubExpressions.storage_;
      goto LAB_00128454;
    }
  }
  else if (EVar1 == NaturalNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(this->field_0).SubExpressions.storage_);
      dVar3 = auVar2._0_8_;
LAB_00128454:
      *(double *)&this->field_0 = dVar3 + *(double *)&right->field_0;
      this->Type = RealNumber;
      return;
    }
    if (EVar1 == IntegerNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)&((right->field_0).SubExpressions.storage_)->field_0 +
           (long)&((this->field_0).SubExpressions.storage_)->field_0);
      this->Type = IntegerNumber;
      return;
    }
    if (EVar1 == NaturalNumber) goto LAB_00128401;
  }
  return;
}

Assistant:

void operator+=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Natural += right.Value.Number.Natural;
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer += right.Value.Number.Integer;
                        Type = ExpressionType::IntegerNumber;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real = (double(Value.Number.Natural) + right.Value.Number.Real);
                        Type              = ExpressionType::RealNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::IntegerNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber:
                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer += right.Value.Number.Integer;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real = (double(Value.Number.Integer) + right.Value.Number.Real);
                        Type              = ExpressionType::RealNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::RealNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Real += double(right.Value.Number.Natural);
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Real += double(right.Value.Number.Integer);
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Real += right.Value.Number.Real;
                        break;
                    }

                    default: {
                    }
                }
            }

            default: {
            }
        }
    }